

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O0

void __thiscall
ParticleArrayTest_Size_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>_>::
~ParticleArrayTest_Size_Test
          (ParticleArrayTest_Size_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>_>
           *this)

{
  void *in_RDI;
  
  ~ParticleArrayTest_Size_Test
            ((ParticleArrayTest_Size_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>_>
              *)0x215ae8);
  operator_delete(in_RDI,0x20);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Size)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles;
    int numParticles = 12;
    for (int i = 0; i < numParticles; i++)
        particles.pushBack(this->randomParticle());
    ASSERT_EQ(numParticles, particles.size());
}